

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsOrientFaceSides(FmsInt num_sides,FmsInt num_faces,FmsInt *face_verts,
                      FmsOrientation *orientations)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  ulong in_RSI;
  int in_EDI;
  int ej;
  int ei;
  int i;
  FmsInt vi [4];
  FmsInt nc [4];
  FmsInt k;
  int n;
  int local_80;
  int local_7c;
  FmsInt local_78 [4];
  long alStack_58 [4];
  ulong local_38;
  int local_2c;
  long local_28;
  long local_20;
  ulong local_18;
  
  local_38 = 0;
  local_2c = in_EDI;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  do {
    if (local_18 <= local_38) {
      return 0;
    }
    for (local_7c = 0; local_7c < local_2c; local_7c = local_7c + 1) {
      iVar1 = FmsIntersectTwoEdges
                        ((FmsInt *)
                         (local_20 + (long)((local_7c + local_2c + -1) % local_2c << 1) * 8),
                         (FmsInt *)(local_20 + (long)(local_7c << 1) * 8),local_78 + local_7c);
      alStack_58[local_7c] = (long)iVar1;
      if (alStack_58[local_7c] == 0) {
        return 1;
      }
    }
    for (local_80 = 0; local_80 < local_2c; local_80 = local_80 + 1) {
      iVar1 = (local_80 + 1) % local_2c;
      if ((*(long *)(local_20 + (long)(local_80 << 1) * 8) !=
           *(long *)(local_20 + (long)(local_80 * 2 + 1) * 8)) &&
         ((alStack_58[local_80] == 1 || (alStack_58[iVar1] == 1)))) {
        if (alStack_58[local_80] == 1) {
          *(bool *)(local_28 + local_80) =
               local_78[local_80] != *(FmsInt *)(local_20 + (long)(local_80 << 1) * 8);
        }
        else {
          *(bool *)(local_28 + local_80) =
               local_78[iVar1] != *(FmsInt *)(local_20 + (long)(local_80 * 2 + 1) * 8);
        }
      }
    }
    local_20 = local_20 + (long)(local_2c << 1) * 8;
    local_28 = local_28 + local_2c;
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

static int FmsOrientFaceSides(FmsInt num_sides, FmsInt num_faces,
                              FmsInt *face_verts,
                              FmsOrientation *orientations) {
  // The size of 'face_verts' must be 2 x 'num_sides' x 'num_faces'.
  // The size of 'orientations' must be 'num_sides' x 'num_faces'.

  // Find edge orientations that if applied to 'face_verts' lead to an array of
  // the form: (a,b,b,c,c,a), for triangles, or (a,b,b,c,c,d,d,a), for quads.
  // If one of the edge orientations cannot be uniquely determined, that edge in
  // the 'orientations' array will remain unmodified, e.g. as initialized by the
  // user.

  const int n = num_sides;
  for (FmsInt k = 0; k < num_faces; k++) {
    FmsInt nc[4], vi[4]; // at most 4 vertices/sides
    for (int i = 0; i < n; i++) {
      nc[i] = FmsIntersectTwoEdges(face_verts+2*((i+n-1)%n),
                                   face_verts+2*i, vi+i);
      if (nc[i] == 0) { E_RETURN(1); }
    }
    for (int ei = 0; ei < n; ei++) {
      int ej = (ei+1)%n;
      if (face_verts[2*ei+0] == face_verts[2*ei+1] ||
          (nc[ei] != 1 && nc[ej] != 1)) {
        // Keep the value of 'orientations[ei]' as is, e.g. as defined by the
        // user.
      } else {
        if (nc[ei] == 1) {
          orientations[ei] = (vi[ei] == face_verts[2*ei+0]) ? 0 : 1;
        } else {
          orientations[ei] = (vi[ej] == face_verts[2*ei+1]) ? 0 : 1;
        }
      }
    }
    face_verts += 2*n;
    orientations += n;
  }
  return 0;
}